

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirOUTPUT(void)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int mode;
  path fnaam;
  
  if (pass != 3) {
    SkipToEol(&lp);
    return;
  }
  GetOutputFileName_abi_cxx11_(&fnaam,&lp);
  bVar2 = comma(&lp);
  mode = 0;
  if (bVar2) {
    iVar4 = SkipBlanks(&lp);
    if (iVar4 != 0) {
LAB_0010e6b8:
      Error("[OUTPUT] Invalid <mode> (valid modes: t, a, r)",bp,PASS3);
      goto LAB_0010e716;
    }
    pcVar1 = lp + 1;
    bVar3 = *lp | 0x20;
    lp = pcVar1;
    if (bVar3 == 0x61) {
      mode = 2;
    }
    else if (bVar3 != 0x74) {
      if (bVar3 != 0x72) goto LAB_0010e6b8;
      mode = 1;
    }
  }
  NewDest(&fnaam,mode);
LAB_0010e716:
  std::filesystem::__cxx11::path::~path(&fnaam);
  return;
}

Assistant:

static void dirOUTPUT() {
	if (LASTPASS != pass) {
		SkipToEol(lp);
		return;
	}
	const std::filesystem::path fnaam = GetOutputFileName(lp);
	char modechar = 0;
	int mode = OUTPUT_TRUNCATE;
	if (comma(lp)) {
		if (!SkipBlanks(lp)) modechar = (*lp++) | 0x20;
		switch (modechar) {
			case 't': mode = OUTPUT_TRUNCATE;	break;
			case 'r': mode = OUTPUT_REWIND;		break;
			case 'a': mode = OUTPUT_APPEND;		break;
			default:
				Error("[OUTPUT] Invalid <mode> (valid modes: t, a, r)", bp);
				return;
		}
	}
	//Options::NoDestinationFile = false;
	NewDest(fnaam, mode);
}